

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_kelvin.cc
# Opt level: O2

bool __thiscall hwtest::pgraph::MthdKelvinPointSprite::is_valid_val(MthdKelvinPointSprite *this)

{
  uint uVar1;
  int iVar2;
  
  if ((~(this->super_SingleMthdTest).super_MthdTest.val & 6) == 0) {
    return false;
  }
  iVar2 = pgraph_3d_class(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp);
  uVar1 = (this->super_SingleMthdTest).super_MthdTest.val;
  if (iVar2 < 6) {
    uVar1 = uVar1 & 0xfffff0f8;
  }
  else {
    uVar1 = uVar1 & 0xfffc00f8;
  }
  return uVar1 == 0;
}

Assistant:

bool is_valid_val() override {
		int mode = extr(val, 1, 2);
		if (mode == 3)
			return false;
		if (pgraph_3d_class(&exp) < PGRAPH_3D_CURIE) {
			return !(val & ~0xf07);
		} else {
			return !(val & ~0x3ff07);
		}
	}